

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O3

int excline(char *line,int llen,int lnum)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  maps_s *pmVar6;
  line *plVar7;
  line *plVar8;
  key *pkVar9;
  bool bVar10;
  long lVar11;
  byte bVar12;
  ulong uVar13;
  char *fname;
  byte *pbVar14;
  uint uVar15;
  int iVar16;
  KEYMAP *pKVar17;
  byte *pbVar18;
  byte *pbVar19;
  char *local_68;
  char *tmp;
  PF local_58;
  line *local_50;
  int local_44;
  KEYMAP *local_40;
  int local_34;
  
  if (inmacro != 0 || macrodef != 0) {
    iVar3 = dobeep_msg("Not now!");
    return iVar3;
  }
  while( true ) {
    bVar2 = *line;
    uVar5 = (ulong)bVar2;
    pbVar14 = (byte *)line;
    if (0x1f < bVar2) break;
    if (bVar2 != 9) {
      if (bVar2 == 0) {
        return 1;
      }
      goto LAB_0010e453;
    }
switchD_0010e3d7_caseD_20:
    line = (char *)((byte *)line + 1);
  }
  switch(bVar2) {
  case 0x20:
    goto switchD_0010e3d7_caseD_20;
  case 0x21:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    break;
  case 0x22:
    goto LAB_0010e413;
  case 0x28:
    iVar3 = foundparen(line,llen,lnum);
    return iVar3;
  default:
    if (bVar2 != 0x3b) break;
  case 0x23:
    *line = 0;
    return 1;
  }
LAB_0010e453:
  while ((bVar2 = (byte)uVar5, 0x29 < bVar2 || ((0x30100000201U >> (uVar5 & 0x3f) & 1) == 0))) {
    uVar5 = (ulong)pbVar14[1];
    pbVar14 = pbVar14 + 1;
  }
  goto LAB_0010e46a;
  while (bVar12 != 0x22) {
LAB_0010e6c7:
    pbVar14 = pbVar14 + (ulong)(bVar12 == 0x5c) + 1;
    bVar12 = *pbVar14;
    if (bVar12 == 0) break;
  }
LAB_0010e6e5:
  if (bVar2 == 0x22) {
    pkVar9 = &key;
    if (iVar3 != 0) {
      local_34 = iVar3;
      plVar8 = lalloc((int)pbVar14 - (int)uVar5);
      if (plVar8 == (line *)0x0) goto LAB_0010eaf9;
      pkVar9 = (key *)&plVar8->l_used;
      iVar3 = local_34;
    }
    pkVar9->k_count = 0;
    do {
      bVar2 = *pbVar18;
      if (bVar2 == 0x5c) {
        pbVar19 = pbVar18 + 1;
        bVar2 = pbVar18[1];
        uVar15 = (uint)bVar2;
        if (bVar2 < 0x4e) {
          uVar4 = bVar2 - 0x30;
          if (uVar4 < 8) {
            if ((pbVar18[2] & 0xf8) == 0x30) {
              uVar4 = (uint)(byte)(pbVar18[2] - 0x30) + uVar4 * 8;
              if ((pbVar18[3] & 0xf8) == 0x30) {
                pbVar19 = pbVar18 + 3;
                uVar4 = (uint)(byte)(pbVar18[3] - 0x30) + uVar4 * 8;
              }
              else {
                pbVar19 = pbVar18 + 2;
              }
            }
          }
          else if (uVar15 == 0x45) {
LAB_0010e919:
            uVar4 = 0x1b;
          }
          else {
            uVar4 = uVar15;
            if (uVar15 == 0x46) {
LAB_0010e8eb:
              if ((cinfo[pbVar18[3]] & 0x20U) == 0) {
                pbVar19 = pbVar18 + 2;
                iVar16 = (char)pbVar18[2] + -0x30;
              }
              else {
                pbVar19 = pbVar18 + 3;
                iVar16 = (int)(char)pbVar18[3] + (char)pbVar18[2] * 10 + -0x210;
              }
              uVar4 = iVar16 + 0x100;
            }
          }
        }
        else {
          uVar4 = 9;
          if (bVar2 < 0x65) {
            if (bVar2 < 0x54) {
              if (bVar2 == 0x4e) {
LAB_0010e90f:
                uVar4 = 10;
              }
              else {
                uVar4 = uVar15;
                if (uVar15 == 0x52) goto LAB_0010e89e;
              }
            }
            else if ((bVar2 != 0x54) && (uVar4 = uVar15, bVar2 == 0x5e)) {
              bVar2 = pbVar18[2];
              uVar4 = (uint)bVar2;
              if ((cinfo[bVar2] & 4U) != 0) {
                uVar4 = bVar2 - 0x20;
              }
              pbVar19 = pbVar18 + 2;
              uVar4 = uVar4 ^ 0x40;
            }
          }
          else if (bVar2 < 0x6e) {
            if (bVar2 == 0x65) goto LAB_0010e919;
            uVar4 = uVar15;
            if (bVar2 == 0x66) goto LAB_0010e8eb;
          }
          else if (bVar2 != 0x74) {
            if (bVar2 == 0x72) {
LAB_0010e89e:
              uVar4 = 0xd;
            }
            else {
              uVar4 = uVar15;
              if (uVar15 == 0x6e) goto LAB_0010e90f;
            }
          }
        }
      }
      else {
        if ((bVar2 == 0) || (bVar2 == 0x22)) goto LAB_0010e940;
        uVar4 = (uint)(char)bVar2;
        pbVar19 = pbVar18;
      }
      pbVar18 = pbVar19 + 1;
      if (iVar3 == 0) {
        lVar11 = (long)key.k_count;
        key.k_count = key.k_count + 1;
        key.k_chars[lVar11] = (KCHAR)uVar4;
      }
      else {
        iVar16 = plVar8->l_used;
        plVar8->l_used = iVar16 + 1;
        plVar8->l_text[iVar16] = (char)uVar4;
      }
    } while( true );
  }
  if (uVar15 != 0x27) {
    pbVar18 = pbVar19;
  }
  iVar16 = (int)pbVar14 - (int)pbVar18;
  local_34 = iVar3;
  plVar8 = lalloc(iVar16 + 1);
  if (plVar8 == (line *)0x0) {
LAB_0010eaf9:
    iVar16 = 0;
    goto LAB_0010ea8b;
  }
  memmove(plVar8->l_text,pbVar18,(long)iVar16);
  plVar8->l_used = plVar8->l_used + -1;
  iVar3 = local_34 + (uint)(local_34 == 0);
LAB_0010e949:
  if (iVar3 == 0) {
    iVar3 = 3;
  }
  else if (iVar3 == 2) {
    plVar8->l_text[plVar8->l_used] = '\0';
    local_40 = name_map(plVar8->l_text);
    if (local_40 == (KEYMAP *)0x0) {
      dobeep_msgs("No such mode:",plVar8->l_text);
      free(plVar8);
      goto LAB_0010ea6f;
    }
    free(plVar8);
    iVar3 = 0;
  }
  else {
    plVar8->l_fp = local_50->l_fp;
    plVar8->l_bp = local_50;
    local_50->l_fp = plVar8;
    local_50 = plVar8;
  }
  bVar2 = *pbVar14;
  if (bVar2 == 0) goto LAB_0010e9f2;
  goto LAB_0010e672;
LAB_0010e940:
  pbVar14 = pbVar14 + (*pbVar14 != 0);
  goto LAB_0010e949;
  while (bVar2 != 0x22) {
LAB_0010e413:
    pbVar14 = pbVar14 + (ulong)((char)uVar5 == '\\') + 1;
    bVar2 = *pbVar14;
    uVar5 = (ulong)bVar2;
    if (bVar2 == 0) break;
  }
LAB_0010e46a:
  tmp = (char *)0x1;
  iVar3 = 0;
  if (bVar2 != 0) {
    *pbVar14 = 0;
    do {
      while( true ) {
        pbVar19 = pbVar14;
        pbVar14 = pbVar19 + 1;
        bVar2 = *pbVar14;
        if (bVar2 < 0x20) break;
        if (bVar2 != 0x20) {
          if ((bVar2 == 0x23) || (bVar2 == 0x3b)) {
            *pbVar14 = 0;
            bVar2 = 0;
          }
          goto LAB_0010e4b3;
        }
      }
    } while (bVar2 == 9);
LAB_0010e4b3:
    if ((bVar2 == 0x2d) || (iVar3 = 0, (cinfo[bVar2] & 0x20U) != 0)) {
      pbVar18 = pbVar14;
      if (bVar2 == 0x22) {
        bVar2 = 0x22;
        do {
          pbVar18 = pbVar19;
          bVar10 = bVar2 == 0x5c;
          bVar2 = pbVar18[(ulong)bVar10 + 2];
          if (bVar2 == 0x22) break;
          pbVar19 = pbVar18 + (ulong)bVar10 + 1;
        } while (bVar2 != 0);
        pbVar18 = pbVar18 + (ulong)bVar10 + 2;
      }
      else {
        while ((0x29 < bVar2 || ((0x30100000201U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
          bVar2 = pbVar18[1];
          pbVar18 = pbVar18 + 1;
        }
      }
      tmp = (char *)strtol((char *)pbVar14,&local_68,10);
      if (*local_68 != '\0') {
        return 0;
      }
      if (tmp + -0x7fffffff < (char *)0xffffffff00000002) {
        return 0;
      }
      pbVar14 = pbVar18;
      iVar3 = 7;
    }
  }
  local_58 = name_function(line);
  if (local_58 == (PF)0x0) {
    iVar3 = dobeep_msgs("Unknown function:",line);
    return iVar3;
  }
  if (local_58 == bindtokey || local_58 == unbindtokey) {
    pmVar6 = &fundamental_mode;
  }
  else {
    if (local_58 != localbind && local_58 != localunbind) {
      local_34 = (local_58 == redefine_key) + 1;
      pKVar17 = (KEYMAP *)0x0;
      goto LAB_0010e621;
    }
    pmVar6 = curbp->b_modes[curbp->b_nmodes];
  }
  pKVar17 = pmVar6->p_map;
  local_34 = 0;
LAB_0010e621:
  iVar16 = 0;
  local_44 = iVar3;
  plVar7 = lalloc(0);
  if (plVar7 != (line *)0x0) {
    maclcur = plVar7;
    plVar7->l_bp = plVar7;
    plVar7->l_fp = plVar7;
    bVar2 = *pbVar14;
    local_40 = pKVar17;
    iVar3 = local_34;
    if (bVar2 != 0) {
      plVar8 = (line *)0x0;
      local_50 = plVar7;
LAB_0010e672:
      uVar5 = (ulong)pbVar14 & 0xffffffff;
      pbVar19 = pbVar14;
LAB_0010e67a:
      uVar15 = (uint)bVar2;
      pbVar18 = pbVar19 + 1;
      pbVar14 = pbVar19;
      if (uVar15 < 0x20) {
        if (uVar15 != 9) {
          if (uVar15 == 0) goto LAB_0010e9f2;
          goto LAB_0010e753;
        }
LAB_0010e69b:
        bVar2 = *pbVar18;
        uVar5 = (ulong)((int)uVar5 + 1);
        pbVar19 = pbVar18;
        goto LAB_0010e67a;
      }
      if (uVar15 < 0x22) {
        if (uVar15 != 0x20) goto LAB_0010e753;
        goto LAB_0010e69b;
      }
      if ((uVar15 == 0x3b) || (uVar15 == 0x23)) {
        *pbVar19 = 0;
        goto LAB_0010e9f2;
      }
      if (uVar15 == 0x22) {
        bVar12 = 0x22;
        goto LAB_0010e6c7;
      }
LAB_0010e753:
      uVar13 = (ulong)uVar15;
      while ((0x29 < (byte)uVar13 || ((0x30100000201U >> (uVar13 & 0x3f) & 1) == 0))) {
        pbVar1 = pbVar14 + 1;
        pbVar14 = pbVar14 + 1;
        uVar13 = (ulong)*pbVar1;
      }
      goto LAB_0010e6e5;
    }
    plVar8 = (line *)0x0;
LAB_0010e9f2:
    if (iVar3 == 1) {
      inmacro = 1;
      maclcur = maclcur->l_fp;
      iVar16 = (*local_58)(local_44,(int)tmp);
      inmacro = 0;
    }
    else if (iVar3 == 3) {
      bVar10 = local_58 == localunbind || local_58 == unbindtokey;
      iVar3 = (int)CONCAT71(0x10e2,bVar10);
      if (bVar10) {
        fname = (char *)0x0;
      }
      else {
        iVar3 = plVar8->l_used;
        plVar8->l_text[iVar3] = '\0';
        fname = plVar8->l_text;
      }
      iVar16 = bindkey((KEYMAP **)local_40,fname,(KCHAR *)(ulong)(uint)key.k_count,iVar3);
    }
    else {
      dobeep_msg("Bad args to set key");
LAB_0010ea6f:
      iVar16 = 0;
    }
LAB_0010ea8b:
    plVar7 = maclcur->l_fp;
    plVar8 = plVar7;
    if (plVar7 != maclcur) {
      do {
        plVar7 = plVar8->l_fp;
        free(plVar8);
        plVar8 = plVar7;
      } while (plVar7 != maclcur);
    }
    free(plVar7);
    maclhead = (line *)0x0;
    macrodef = 0;
  }
  return iVar16;
}

Assistant:

int
excline(char *line, int llen, int lnum)
{
	PF	 fp;
	struct line	*lp, *np;
	int	 status, c, f, n;
	char	*funcp, *tmp;
	char	*argp = NULL;
	long	 nl;
	int	 bind;
	KEYMAP	*curmap = NULL;
#define BINDARG		0  /* this arg is key to bind (local/global set key) */
#define	BINDNO		1  /* not binding or non-quoted BINDARG */
#define BINDNEXT	2  /* next arg " (define-key) */
#define BINDDO		3  /* already found key to bind */
#define BINDEXT		1  /* space for trailing \0 */

	lp = NULL;

	if (macrodef || inmacro)
		return (dobeep_msg("Not now!"));

	f = 0;
	n = 1;
	funcp = skipwhite(line);
	if (*funcp == '\0')
		return (TRUE);	/* No error on blank lines */
	if (*funcp == '(')
		return (foundparen(funcp, llen, lnum));
	line = parsetoken(funcp);
	if (*line != '\0') {
		*line++ = '\0';
		line = skipwhite(line);
		if (ISDIGIT(*line) || *line == '-') {
			argp = line;
			line = parsetoken(line);
		}
	}
	if (argp != NULL) {
		f = FFARG;
		nl = strtol(argp, &tmp, 10);
		if (*tmp != '\0')
			return (FALSE);
		if (nl >= INT_MAX || nl <= INT_MIN)
			return (FALSE);
		n = (int)nl;
	}
	if ((fp = name_function(funcp)) == NULL)
		return (dobeep_msgs("Unknown function:", funcp));

	if (fp == bindtokey || fp == unbindtokey) {
		bind = BINDARG;
		curmap = fundamental_map;
	} else if (fp == localbind || fp == localunbind) {
		bind = BINDARG;
		curmap = curbp->b_modes[curbp->b_nmodes]->p_map;
	} else if (fp == redefine_key)
		bind = BINDNEXT;
	else
		bind = BINDNO;
	/* Pack away all the args now... */
	if ((np = lalloc(0)) == FALSE)
		return (FALSE);
	np->l_fp = np->l_bp = maclcur = np;
	while (*line != '\0') {
		argp = skipwhite(line);
		if (*argp == '\0')
			break;
		line = parsetoken(argp);
		if (*argp != '"') {
			if (*argp == '\'')
				++argp;
			if ((lp = lalloc((int) (line - argp) + BINDEXT)) ==
			    NULL) {
				status = FALSE;
				goto cleanup;
			}
			bcopy(argp, ltext(lp), (int)(line - argp));
			/* don't count BINDEXT */
			lp->l_used--;
			if (bind == BINDARG)
				bind = BINDNO;
		} else {
			/* quoted strings are special */
			++argp;
			if (bind != BINDARG) {
				lp = lalloc((int)(line - argp) + BINDEXT);
				if (lp == NULL) {
					status = FALSE;
					goto cleanup;
				}
				lp->l_used = 0;
			} else
				key.k_count = 0;
			while (*argp != '"' && *argp != '\0') {
				if (*argp != '\\')
					c = *argp++;
				else {
					switch (*++argp) {
					case 't':
					case 'T':
						c = CCHR('I');
						break;
					case 'n':
					case 'N':
						c = CCHR('J');
						break;
					case 'r':
					case 'R':
						c = CCHR('M');
						break;
					case 'e':
					case 'E':
						c = CCHR('[');
						break;
					case '^':
						/*
						 * split into two statements
						 * due to bug in OSK cpp
						 */
						c = CHARMASK(*++argp);
						c = ISLOWER(c) ?
						    CCHR(TOUPPER(c)) : CCHR(c);
						break;
					case '0':
					case '1':
					case '2':
					case '3':
					case '4':
					case '5':
					case '6':
					case '7':
						c = *argp - '0';
						if (argp[1] <= '7' &&
						    argp[1] >= '0') {
							c <<= 3;
							c += *++argp - '0';
							if (argp[1] <= '7' &&
							    argp[1] >= '0') {
								c <<= 3;
								c += *++argp
								    - '0';
							}
						}
						break;
					case 'f':
					case 'F':
						c = *++argp - '0';
						if (ISDIGIT(argp[1])) {
							c *= 10;
							c += *++argp - '0';
						}
						c += KFIRST;
						break;
					default:
						c = CHARMASK(*argp);
						break;
					}
					argp++;
				}
				if (bind == BINDARG)
					key.k_chars[key.k_count++] = c;
				else
					lp->l_text[lp->l_used++] = c;
			}
			if (*line)
				line++;
		}
		switch (bind) {
		case BINDARG:
			bind = BINDDO;
			break;
		case BINDNEXT:
			lp->l_text[lp->l_used] = '\0';
			if ((curmap = name_map(lp->l_text)) == NULL) {
				(void)dobeep_msgs("No such mode:", lp->l_text);
				status = FALSE;
				free(lp);
				goto cleanup;
			}
			free(lp);
			bind = BINDARG;
			break;
		default:
			lp->l_fp = np->l_fp;
			lp->l_bp = np;
			np->l_fp = lp;
			np = lp;
		}
	}
	switch (bind) {
	default:
		(void)dobeep_msg("Bad args to set key");
		status = FALSE;
		break;
	case BINDDO:
		if (fp != unbindtokey && fp != localunbind) {
			lp->l_text[lp->l_used] = '\0';
			status = bindkey(&curmap, lp->l_text, key.k_chars,
			    key.k_count);
		} else
			status = bindkey(&curmap, NULL, key.k_chars,
			    key.k_count);
		break;
	case BINDNO:
		inmacro = TRUE;
		maclcur = maclcur->l_fp;
		status = (*fp)(f, n);
		inmacro = FALSE;
	}
cleanup:
	lp = maclcur->l_fp;
	while (lp != maclcur) {
		np = lp->l_fp;
		free(lp);
		lp = np;
	}
	free(lp);
	maclhead = NULL;
	macrodef = FALSE;
	return (status);
}